

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclUtil.c
# Opt level: O1

void Abc_SclSclGates2MioGates(SC_Lib *pLib,Abc_Ntk_t *p)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  long *plVar4;
  long lVar5;
  int *__ptr;
  Vec_Ptr_t *pVVar6;
  Mio_Gate_t *pMVar7;
  undefined8 *puVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  
  if (p->vGates == (Vec_Int_t *)0x0) {
    __assert_fail("p->vGates != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclUtil.c"
                  ,0x4b,"void Abc_SclSclGates2MioGates(SC_Lib *, Abc_Ntk_t *)");
  }
  pVVar6 = p->vObjs;
  if (pVVar6->nSize < 1) {
    uVar10 = 0;
    uVar9 = 0;
  }
  else {
    lVar11 = 0;
    uVar9 = 0;
    uVar10 = 0;
    do {
      plVar4 = (long *)pVVar6->pArray[lVar11];
      if ((((plVar4 != (long *)0x0) && ((*(uint *)((long)plVar4 + 0x14) & 0xf) == 7)) &&
          (iVar1 = *(int *)((long)plVar4 + 0x1c), iVar1 != 0)) &&
         (((lVar5 = *plVar4, iVar1 != 1 || (*(int *)(lVar5 + 4) != 4)) || (plVar4[7] != 0)))) {
        iVar2 = (int)plVar4[2];
        if (((long)iVar2 < 0) || (*(int *)(*(long *)(lVar5 + 0x178) + 4) <= iVar2)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar3 = *(uint *)(*(long *)(*(long *)(lVar5 + 0x178) + 8) + (long)iVar2 * 4);
        if ((ulong)uVar3 == 0xffffffff) {
          puVar8 = (undefined8 *)0x0;
        }
        else {
          if (((int)uVar3 < 0) || (*(int *)(*(long *)(lVar5 + 0x170) + 100) <= (int)uVar3)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          puVar8 = *(undefined8 **)(*(long *)(*(long *)(lVar5 + 0x170) + 0x68) + (ulong)uVar3 * 8);
        }
        if (*(int *)(puVar8 + 8) != iVar1) {
          __assert_fail("pCell->n_inputs == Abc_ObjFaninNum(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclUtil.c"
                        ,0x4f,"void Abc_SclSclGates2MioGates(SC_Lib *, Abc_Ntk_t *)");
        }
        pMVar7 = Mio_LibraryReadGateByName((Mio_Library_t *)p->pManFunc,(char *)*puVar8,(char *)0x0)
        ;
        plVar4[7] = (long)pMVar7;
        if ((*(byte *)((long)plVar4 + 0x14) & 0x30) != 0) {
          __assert_fail("pObj->fMarkA == 0 && pObj->fMarkB == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclUtil.c"
                        ,0x52,"void Abc_SclSclGates2MioGates(SC_Lib *, Abc_Ntk_t *)");
        }
        uVar10 = uVar10 + (pMVar7 == (Mio_Gate_t *)0x0);
        uVar9 = uVar9 + 1;
      }
      lVar11 = lVar11 + 1;
      pVVar6 = p->vObjs;
    } while (lVar11 < pVVar6->nSize);
  }
  if (uVar10 != 0) {
    printf("Could not find %d (out of %d) gates in the current library.\n",(ulong)uVar10,
           (ulong)uVar9);
  }
  if (p->vGates != (Vec_Int_t *)0x0) {
    __ptr = p->vGates->pArray;
    if (__ptr != (int *)0x0) {
      free(__ptr);
      p->vGates->pArray = (int *)0x0;
    }
    if (p->vGates != (Vec_Int_t *)0x0) {
      free(p->vGates);
      p->vGates = (Vec_Int_t *)0x0;
    }
  }
  p->pSCLib = (void *)0x0;
  return;
}

Assistant:

void Abc_SclSclGates2MioGates( SC_Lib * pLib, Abc_Ntk_t * p )
{
    Abc_Obj_t * pObj;
    SC_Cell * pCell;
    int i, Counter = 0, CounterAll = 0;
    assert( p->vGates != NULL );
    Abc_NtkForEachNodeNotBarBuf1( p, pObj, i )
    {
        pCell = Abc_SclObjCell(pObj);
        assert( pCell->n_inputs == Abc_ObjFaninNum(pObj) );
        pObj->pData = Mio_LibraryReadGateByName( (Mio_Library_t *)p->pManFunc, pCell->pName, NULL );
        Counter += (pObj->pData == NULL);
        assert( pObj->fMarkA == 0 && pObj->fMarkB == 0 );
        CounterAll++;
    }
    if ( Counter )
        printf( "Could not find %d (out of %d) gates in the current library.\n", Counter, CounterAll );
    Vec_IntFreeP( &p->vGates );
    p->pSCLib = NULL;
}